

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

ErrorOr<llvm::MD5::MD5Result> *
llvm::sys::fs::md5_contents(ErrorOr<llvm::MD5::MD5Result> *__return_storage_ptr__,int FD)

{
  MD5_u32plus __fd;
  int iVar1;
  uchar *puVar2;
  ssize_t sVar3;
  int *piVar4;
  error_category *__cat;
  uchar *in_RCX;
  size_t in_RDX;
  undefined4 in_register_00000034;
  error_code EC;
  ArrayRef<unsigned_char> Data;
  undefined1 local_10c [8];
  MD5Result Result;
  error_category *local_f0;
  allocator<unsigned_char> local_d1;
  int BytesRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Buf;
  size_t BufSize;
  MD5 Hash;
  int FD_local;
  
  Hash.block[0xe] = FD;
  unique0x100001f1 = __return_storage_ptr__;
  MD5::MD5((MD5 *)((long)&BufSize + 4),(uchar *)CONCAT44(in_register_00000034,FD),in_RDX,in_RCX);
  Buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1000;
  std::allocator<unsigned_char>::allocator(&local_d1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&BytesRead,0x1000,&local_d1);
  std::allocator<unsigned_char>::~allocator(&local_d1);
  while( true ) {
    __fd = Hash.block[0xe];
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&BytesRead);
    sVar3 = read(__fd,puVar2,0x1000);
    iVar1 = (int)sVar3;
    if (iVar1 < 1) break;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&BytesRead);
    Data = makeArrayRef<unsigned_char>(puVar2,(long)iVar1);
    MD5::update((MD5 *)((long)&BufSize + 4),Data);
  }
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    __cat = (error_category *)std::_V2::generic_category();
    std::error_code::error_code((error_code *)(Result.Bytes._M_elems + 0xc),iVar1,__cat);
    EC._4_4_ = 0;
    EC._M_value._0_1_ = Result.Bytes._M_elems[0xc];
    EC._M_value._1_1_ = Result.Bytes._M_elems[0xd];
    EC._M_value._2_1_ = Result.Bytes._M_elems[0xe];
    EC._M_value._3_1_ = Result.Bytes._M_elems[0xf];
    EC._M_cat = local_f0;
    ErrorOr<llvm::MD5::MD5Result>::ErrorOr(__return_storage_ptr__,EC);
  }
  else {
    MD5::final((MD5 *)((long)&BufSize + 4),(MD5Result *)local_10c);
    ErrorOr<llvm::MD5::MD5Result>::ErrorOr<llvm::MD5::MD5Result>
              (__return_storage_ptr__,(MD5Result *)local_10c,(type *)0x0);
  }
  Result.Bytes._M_elems[8] = '\x01';
  Result.Bytes._M_elems[9] = '\0';
  Result.Bytes._M_elems[10] = '\0';
  Result.Bytes._M_elems[0xb] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&BytesRead);
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<MD5::MD5Result> md5_contents(int FD) {
  MD5 Hash;

  constexpr size_t BufSize = 4096;
  std::vector<uint8_t> Buf(BufSize);
  int BytesRead = 0;
  for (;;) {
    BytesRead = read(FD, Buf.data(), BufSize);
    if (BytesRead <= 0)
      break;
    Hash.update(makeArrayRef(Buf.data(), BytesRead));
  }

  if (BytesRead < 0)
    return std::error_code(errno, std::generic_category());
  MD5::MD5Result Result;
  Hash.final(Result);
  return Result;
}